

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

void * yang_read_deviate(lys_deviation *dev,LYS_DEVIATE_TYPE mod)

{
  lys_deviate *__ptr;
  LY_ERR *pLVar1;
  uint uVar2;
  byte bVar4;
  ulong uVar3;
  
  bVar4 = dev->deviate_size;
  uVar3 = (ulong)bVar4;
  uVar2 = (uint)bVar4;
  __ptr = dev->deviate;
  if (bVar4 == 0) {
    uVar2 = 0;
  }
  else {
    if (__ptr->mod == LY_DEVIATE_NO) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"not-supported");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "\"not-supported\" deviation cannot be combined with any other deviation.");
      return (void *)0x0;
    }
    if ((bVar4 & 7) != 0) goto LAB_00148f4c;
  }
  __ptr = (lys_deviate *)realloc(__ptr,(ulong)(uVar2 * 0x48 + 0x240));
  if (__ptr == (lys_deviate *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_deviate");
    return (void *)0x0;
  }
  bVar4 = dev->deviate_size;
  uVar3 = (ulong)bVar4;
  memset(__ptr + uVar3,0,0x240);
  dev->deviate = __ptr;
LAB_00148f4c:
  __ptr[uVar3].mod = mod;
  dev->deviate_size = bVar4 + 1;
  return __ptr + uVar3;
}

Assistant:

void *
yang_read_deviate(struct lys_deviation *dev, LYS_DEVIATE_TYPE mod)
{
    struct lys_deviate *deviate;

    if (dev->deviate_size && dev->deviate[0].mod == LY_DEVIATE_NO) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "not-supported");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "\"not-supported\" deviation cannot be combined with any other deviation.");
        return NULL;
    }
    if (!(dev->deviate_size % LY_YANG_ARRAY_SIZE)) {
        deviate = realloc(dev->deviate, (LY_YANG_ARRAY_SIZE + dev->deviate_size) * sizeof *deviate);
        if (!deviate) {
            LOGMEM;
            return NULL;
        }
        memset(deviate + dev->deviate_size, 0, LY_YANG_ARRAY_SIZE * sizeof *deviate);
        dev->deviate = deviate;
    }
    dev->deviate[dev->deviate_size].mod = mod;
    return &dev->deviate[dev->deviate_size++];
}